

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O0

void SndEmu_FreeDevLinkData(DEV_INFO *devInf)

{
  uint local_14;
  UINT32 curLDev;
  DEV_INFO *devInf_local;
  
  if (devInf->linkDevCount != 0) {
    for (local_14 = 0; local_14 < devInf->linkDevCount; local_14 = local_14 + 1) {
      free(devInf->linkDevs[local_14].cfg);
    }
    free(devInf->linkDevs);
    devInf->linkDevs = (DEVLINK_INFO *)0x0;
    devInf->linkDevCount = 0;
  }
  return;
}

Assistant:

void SndEmu_FreeDevLinkData(DEV_INFO* devInf)
{
	UINT32 curLDev;
	
	if (! devInf->linkDevCount)
		return;
	
	for (curLDev = 0; curLDev < devInf->linkDevCount; curLDev ++)
		free(devInf->linkDevs[curLDev].cfg);
	free(devInf->linkDevs);	devInf->linkDevs = NULL;
	devInf->linkDevCount = 0;
	
	return;
}